

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O1

cmGlobalGenerator * __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3> *this,string *name,
          cmake *cm)

{
  int iVar1;
  cmGlobalUnixMakefileGenerator3 *this_00;
  undefined6 local_20;
  undefined2 uStack_1a;
  undefined6 uStack_18;
  undefined1 local_12;
  
  local_20 = 0x4d2078696e55;
  uStack_1a = 0x6b61;
  uStack_18 = 0x73656c696665;
  local_12 = 0;
  if ((name->_M_string_length == 0xe) &&
     (iVar1 = bcmp((name->_M_dataplus)._M_p,&local_20,0xe), iVar1 == 0)) {
    this_00 = (cmGlobalUnixMakefileGenerator3 *)operator_new(0x698);
    cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3(this_00,cm);
    return (cmGlobalGenerator *)this_00;
  }
  return (cmGlobalGenerator *)0x0;
}

Assistant:

cmGlobalGenerator* CreateGlobalGenerator(const std::string& name,
                                           cmake* cm) const CM_OVERRIDE
  {
    if (name != T::GetActualName()) {
      return CM_NULLPTR;
    }
    return new T(cm);
  }